

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O3

int Ivy_TruthDecompose_rec(uint uTruth,Vec_Int_t *vTree)

{
  Vec_Int_t *pVVar1;
  int Shift_1;
  long lVar2;
  byte bVar3;
  long lVar4;
  int Shift;
  int *piVar5;
  uint uCofactor_1;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uCofactor;
  uint uVar13;
  int Supp [5];
  int Vars0 [5];
  int Vars1 [5];
  int Vars2 [5];
  byte local_bf [3];
  uint local_bc;
  ulong local_b8;
  Vec_Int_t *local_b0;
  uint local_a8 [8];
  int local_88 [8];
  int local_68 [8];
  int local_48 [6];
  
  iVar12 = 0;
  lVar2 = 0;
  uVar10 = 0;
  uVar9 = 0;
  uVar7 = 0;
  local_bc = 0;
  do {
    uVar13 = s_Masks[lVar2][0] & uTruth;
    if (uVar13 == 0) {
      lVar4 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      local_88[lVar4] = iVar12;
    }
    else {
      uVar6 = s_Masks[lVar2][1] & uTruth;
      if (uVar6 == 0) {
        lVar4 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        local_88[lVar4] = iVar12 + 1;
      }
      else if (uVar13 == s_Masks[lVar2][0]) {
        lVar4 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        local_68[lVar4] = iVar12;
      }
      else if (uVar6 == s_Masks[lVar2][1]) {
        lVar4 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        local_68[lVar4] = iVar12 + 1;
      }
      else {
        bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
        uVar13 = uVar13 << (bVar3 & 0x1f) | uVar13;
        uVar6 = uVar6 >> (bVar3 & 0x1f) | uVar6;
        if ((uVar6 ^ uVar13) == 0xffffffff) {
          lVar4 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          local_48[lVar4] = iVar12;
        }
        else if (uVar13 != uVar6) {
          lVar4 = (long)(int)local_bc;
          local_bc = local_bc + 1;
          local_a8[lVar4] = (uint)lVar2;
        }
      }
    }
    lVar2 = lVar2 + 1;
    iVar12 = iVar12 + 2;
  } while (lVar2 != 5);
  local_b0 = vTree;
  if (uVar9 != 0 && uVar7 != 0) {
    __assert_fail("Count0 == 0 || Count1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xf8,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar10 != 0 && uVar7 != 0) {
    __assert_fail("Count0 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xf9,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar9 != 0 && uVar10 != 0) {
    __assert_fail("Count1 == 0 || Count2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                  ,0xfa,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
  }
  if (uVar7 != 1 || local_bc != 0) {
    if ((uVar7 == 0 && uVar9 == 0) && uVar10 == 0) {
      if ((int)local_bc < 3) {
        __assert_fail("nSupp >= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x145,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
      }
      uVar8 = 0;
LAB_007dba6c:
      local_b8 = (ulong)local_a8[uVar8];
      lVar2 = (long)(local_b8 << 0x21) >> 0x21;
      uVar7 = s_Masks[lVar2][0] & uTruth;
      bVar3 = (byte)(1 << ((byte)local_a8[uVar8] & 0x1f));
      uVar10 = s_Masks[lVar2][1] & uTruth;
      uVar7 = uVar7 << (bVar3 & 0x1f) | uVar7;
      uVar10 = uVar10 >> (bVar3 & 0x1f) | uVar10;
      uVar11 = 0;
      do {
        if (uVar8 != uVar11) {
          lVar2 = (long)((ulong)local_a8[uVar11] << 0x21) >> 0x21;
          uVar9 = s_Masks[lVar2][1] & uVar7;
          bVar3 = (byte)(1 << ((byte)local_a8[uVar11] & 0x1f));
          uVar13 = s_Masks[lVar2][0] & uVar7;
          if (((uVar9 >> (bVar3 & 0x1f) | uVar9) != (uVar13 << (bVar3 & 0x1f) | uVar13)) &&
             (uVar9 = s_Masks[lVar2][1] & uVar10, uVar13 = s_Masks[lVar2][0] & uVar10,
             (uVar9 >> (bVar3 & 0x1f) | uVar9) != (uVar13 << (bVar3 & 0x1f) | uVar13)))
          goto LAB_007dbb1d;
        }
        uVar11 = uVar11 + 1;
        if (local_bc == uVar11) {
          uVar7 = Ivy_TruthDecompose_rec(uVar7,vTree);
          if ((uVar7 == 0xffffffff) ||
             (uVar10 = Ivy_TruthDecompose_rec(uVar10,local_b0), uVar10 == 0xffffffff))
          goto LAB_007dbb96;
          uVar10 = (uVar10 & 0xf) * 0x1000 + ((uVar7 & 0xf) << 0x10 | ((uint)local_b8 & 7) << 9) +
                   0x65;
          goto LAB_007dbcd9;
        }
      } while( true );
    }
    uVar13 = 3;
    if ((int)uVar7 < 1) {
      if ((int)uVar9 < 1) {
        if ((int)uVar10 < 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                        ,0x10d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
        }
        local_b8 = 0;
        piVar5 = local_48;
        uVar13 = 4;
      }
      else {
        uTruth = ~uTruth;
        local_b8 = 1;
        piVar5 = local_68;
        uVar10 = uVar9;
      }
    }
    else {
      local_b8 = 0;
      piVar5 = local_88;
      uVar10 = uVar7;
    }
    uVar8 = 0;
    uVar7 = ((0 < (int)local_bc) + uVar10 & 7) << 5 | uVar13;
    do {
      uVar13 = uVar7;
      uVar7 = piVar5[uVar8];
      uVar6 = uTruth & s_Masks[(int)uVar7 >> 1][uVar7 & 1 ^ 1];
      bVar3 = (byte)(1 << ((byte)((int)uVar7 >> 1) & 0x1f));
      uVar9 = uVar6 >> (bVar3 & 0x1f);
      if ((uVar7 & 1) != 0) {
        uVar9 = uVar6 << (bVar3 & 0x1f);
      }
      if (uVar8 == 6) goto LAB_007dbf21;
      uTruth = uVar9 | uVar6;
      uVar7 = uVar13 & 0xfffff0ff | (uVar7 & 0xf) << 8;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    uVar9 = (uint)local_b8;
    if ((int)local_bc < 1) {
      if ((uVar13 & 0xf) == 4) {
        uVar9 = uVar13 >> 5 & 1 ^ uVar9 ^ 1 ^ (uint)(uTruth == 0);
      }
      Vec_IntPush(vTree,uVar7);
      local_88[0] = uVar9 + vTree->nSize * 2 + -2;
    }
    else {
      if (uTruth + 1 < 2) {
        __assert_fail("uTruthCof != 0 && ~uTruthCof != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x11d,"int Ivy_TruthDecompose_rec(unsigned int, Vec_Int_t *)");
      }
      iVar12 = Ivy_TruthDecompose_rec(uTruth,vTree);
      if (iVar12 != -1) {
        if (uVar10 < 6) {
          iVar12 = (*(code *)(&DAT_00a451b8 + *(int *)(&DAT_00a451b8 + (ulong)(uVar10 - 1) * 4)))();
          return iVar12;
        }
LAB_007dbf21:
        __assert_fail("iNum >= 0 && iNum <= 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x76,"void Ivy_DecSetVar(Ivy_Dec_t *, int, unsigned int)");
      }
      local_88[0] = -1;
    }
  }
  return local_88[0];
LAB_007dbb1d:
  uVar8 = uVar8 + 1;
  if (uVar8 == local_bc) {
LAB_007dbb96:
    if (local_bc != 3) {
      return -1;
    }
    uVar10 = (uTruth >> 1 & 0x55555555) + (uTruth & 0x55555555);
    uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
    uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
    uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
    if ((uVar10 >> 0x10) + (uVar10 & 0xffff) != 0x10) {
      return -1;
    }
    local_bf[2] = 0;
    local_bf[0] = 0;
    local_bf[1] = 0;
    uVar10 = 0;
    do {
      lVar2 = 0;
      uVar7 = 0;
      do {
        if ((uVar10 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
          uVar7 = uVar7 | 1 << ((byte)local_a8[lVar2] & 0x1f);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      if (0x1f < uVar7) {
        __assert_fail("Num < 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                      ,0x177,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
      }
      if ((uTruth >> (uVar7 & 0x1f) & 1) != 0) {
        lVar2 = 0;
        do {
          if ((uVar10 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
            local_bf[lVar2] = local_bf[lVar2] + 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 8);
    if ((local_bf[0] | 2) != 3) {
      __assert_fail("Count[0] == 1 || Count[0] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x17e,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    if ((local_bf[1] & 0xfd) != 1) {
      __assert_fail("Count[1] == 1 || Count[1] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x17f,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    if ((local_bf[2] & 0xfd) != 1) {
      __assert_fail("Count[2] == 1 || Count[2] == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                    ,0x180,"int Ivy_TruthRecognizeMuxMaj(unsigned int, int *, int, Vec_Int_t *)");
    }
    uVar10 = (uint)(local_bf[0] == 1) << 8 | (uint)(local_bf[1] == 1) << 0xc |
             (uint)(local_bf[2] == 1) << 0x10 | (local_a8[0] & 7) << 9 | (local_a8[1] & 7) << 0xd |
             (local_a8[2] & 7) << 0x11 | 0x66;
LAB_007dbcd9:
    pVVar1 = local_b0;
    Vec_IntPush(local_b0,uVar10);
    return pVVar1->nSize * 2 + -2;
  }
  goto LAB_007dba6c;
}

Assistant:

int Ivy_TruthDecompose_rec( unsigned uTruth, Vec_Int_t * vTree )
{
    Ivy_Dec_t Node;
    int Supp[5], Vars0[5], Vars1[5], Vars2[5], * pVars = NULL;
    int nSupp, Count0, Count1, Count2, nVars = 0, RetValue, fCompl = 0, i;
    unsigned uTruthCof, uCof0, uCof1;

    // get constant confactors
    Count0 = Count1 = Count2 = nSupp = 0;
    for ( i = 0; i < 5; i++ )
    {
        if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 0) )
            Vars0[Count0++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 0) )
            Vars0[Count0++] = (i << 1) | 1;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 0, 1) )
            Vars1[Count1++] = (i << 1) | 0;
        else if ( Ivy_TruthCofactorIsConst(uTruth, i, 1, 1) )
            Vars1[Count1++] = (i << 1) | 1;
        else
        {
            uCof0 = Ivy_TruthCofactor( uTruth, (i << 1) | 1 );
            uCof1 = Ivy_TruthCofactor( uTruth, (i << 1) | 0 );
            if ( uCof0 == ~uCof1 )
                Vars2[Count2++] = (i << 1) | 0;
            else if ( uCof0 != uCof1 )
                Supp[nSupp++] = i;
        }
    }
    assert( Count0 == 0 || Count1 == 0 );
    assert( Count0 == 0 || Count2 == 0 );
    assert( Count1 == 0 || Count2 == 0 );

    // consider the case of a single variable
    if ( Count0 == 1 && nSupp == 0 )
        return Vars0[0];

    // consider more complex decompositions
    if ( Count0 == 0 && Count1 == 0 && Count2 == 0 )
        return Ivy_TruthRecognizeMuxMaj( uTruth, Supp, nSupp, vTree );

    // extract the nodes
    Ivy_DecClear( &Node );
    if ( Count0 > 0 )
        nVars = Count0, pVars = Vars0, Node.Type = IVY_DEC_AND,  fCompl = 0;
    else if ( Count1 > 0 )
        nVars = Count1, pVars = Vars1, Node.Type = IVY_DEC_AND,  fCompl = 1, uTruth = ~uTruth;
    else if ( Count2 > 0 )
        nVars = Count2, pVars = Vars2, Node.Type = IVY_DEC_EXOR, fCompl = 0;
    else 
        assert( 0 );
    Node.nFans = nVars+(nSupp>0);

    // compute cofactor
    uTruthCof = uTruth;
    for ( i = 0; i < nVars; i++ )
    {
        uTruthCof = Ivy_TruthCofactor( uTruthCof, pVars[i] );
        Ivy_DecSetVar( &Node, i, pVars[i] );
    }

    if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= ((Node.nFans & 1) == 0);

    if ( nSupp > 0 )
    {
        assert( uTruthCof != 0 && ~uTruthCof != 0 );
        // call recursively
        RetValue = Ivy_TruthDecompose_rec( uTruthCof, vTree );
        // quit if non-decomposable
        if ( RetValue == -1 )
            return -1;
        // remove the complement from the child if the node is EXOR
        if ( Node.Type == IVY_DEC_EXOR && (RetValue & 1) )
        {
            fCompl ^= 1;
            RetValue ^= 1;
        }
        // set the new decomposition
        Ivy_DecSetVar( &Node, nVars, RetValue );
    }
    else if ( Node.Type == IVY_DEC_EXOR )
        fCompl ^= (uTruthCof == 0);

    Vec_IntPush( vTree, Ivy_DecToInt(Node) );
    return ((Vec_IntSize(vTree)-1) << 1) | fCompl;
}